

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::emit_argument_buffer_aliased_descriptor
          (CompilerMSL *this,SPIRVariable *aliased_var,SPIRVariable *base_var)

{
  ID *__k;
  uint32_t id;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Meta *pMVar4;
  SPIRType *pSVar5;
  SPIRType *type;
  char *pcVar6;
  mapped_type *pmVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  string *this_00;
  char (*ts_9) [3];
  char (*in_stack_fffffffffffffef8) [3];
  string local_f8;
  string ref_type;
  string unqualified_name;
  string name;
  string descriptor_storage;
  char *local_58;
  string local_50;
  
  pMVar4 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,
                               (ID)(base_var->super_IVariant).self.id);
  if (pMVar4 == (Meta *)0x0) {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&unqualified_name,this,(ulong)(base_var->super_IVariant).self.id,0);
  }
  else {
    bVar3 = (pMVar4->decoration).qualified_alias_explicit_override;
    (pMVar4->decoration).qualified_alias_explicit_override = false;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
              (&unqualified_name,this,(ulong)(base_var->super_IVariant).self.id,0);
    (pMVar4->decoration).qualified_alias_explicit_override = bVar3;
  }
  if (((2 < unqualified_name._M_string_length) && (*unqualified_name._M_dataplus._M_p == '(')) &&
     (unqualified_name._M_dataplus._M_p[1] == '*')) {
    ::std::__cxx11::string::erase
              (&unqualified_name,unqualified_name._M_dataplus._M_p,
               unqualified_name._M_dataplus._M_p + 2);
    ::std::__cxx11::string::pop_back();
  }
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  pSVar5 = Compiler::get<spirv_cross::SPIRType>
                     ((Compiler *)this,*(uint32_t *)&(aliased_var->super_IVariant).field_0xc);
  type = Compiler::get_variable_data_type((Compiler *)this,aliased_var);
  pcVar6 = descriptor_address_space
                     (this,(aliased_var->super_IVariant).self.id,aliased_var->storage,"");
  ::std::__cxx11::string::string((string *)&descriptor_storage,pcVar6,(allocator *)&ref_type);
  __k = &(aliased_var->super_IVariant).self;
  if (aliased_var->storage == StorageClassUniformConstant) {
    bVar3 = is_var_runtime_size_array(this,aliased_var);
    if (bVar3) {
      pSVar5 = Compiler::get_variable_data_type((Compiler *)this,aliased_var);
      type_to_glsl_abi_cxx11_(&local_f8,this,pSVar5,__k->id,true);
      join<char_const(&)[18],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&,char_const(&)[2]>
                (&ref_type,(spirv_cross *)0x3a803b,(char (*) [18])&descriptor_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36c2c9,
                 (char (*) [2])&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39df33,
                 (char (*) [4])&unqualified_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
                 (char (*) [2])in_stack_fffffffffffffef8);
    }
    else {
      pSVar5 = Compiler::get_variable_data_type((Compiler *)this,aliased_var);
      type_to_glsl_abi_cxx11_(&local_f8,this,pSVar5,__k->id,true);
      join<char_const(&)[18],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[5],std::__cxx11::string&,char_const(&)[3]>
                (&ref_type,(spirv_cross *)0x3a803b,(char (*) [18])&descriptor_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36c2c9,
                 (char (*) [2])&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" &>(",
                 (char (*) [5])&unqualified_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a919c,
                 in_stack_fffffffffffffef8);
    }
    ::std::__cxx11::string::operator=((string *)&name,(string *)&ref_type);
    ::std::__cxx11::string::~string((string *)&ref_type);
    this_00 = &local_f8;
  }
  else {
    bVar3 = this->is_using_builtin_array;
    this->is_using_builtin_array = true;
    bVar1 = Compiler::is_array((Compiler *)this,type);
    if (bVar1) {
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)__k->id;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x26])(&local_f8,this,pSVar5);
      join<char_const(&)[4],std::__cxx11::string>
                (&ref_type,(spirv_cross *)0x3907ab,(char (*) [4])&local_f8,ts_1);
      ::std::__cxx11::string::~string((string *)&local_f8);
    }
    else {
      ::std::__cxx11::string::string((string *)&ref_type,"&",(allocator *)&local_f8);
    }
    bVar2 = is_var_runtime_size_array(this,aliased_var);
    if (bVar2) {
      type_to_glsl_abi_cxx11_(&local_50,this,pSVar5,__k->id,true);
      join<char_const(&)[18],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[6],std::__cxx11::string&,char_const(&)[2]>
                (&local_f8,(spirv_cross *)0x3a803b,(char (*) [18])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36c2c9,
                 (char (*) [2])&descriptor_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" *>(&",
                 (char (*) [6])&unqualified_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a9fc7,
                 (char (*) [2])in_stack_fffffffffffffef8);
    }
    else {
      local_58 = "*";
      if (bVar1) {
        local_58 = "";
      }
      ts_9 = (char (*) [3])0x273dc4;
      type_to_glsl_abi_cxx11_(&local_50,this,pSVar5,__k->id,true);
      join<char_const*,char_const(&)[18],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string&,char_const(&)[3]>
                (&local_f8,(spirv_cross *)&local_58,(char **)0x3a803b,(char (*) [18])&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36c2c9,
                 (char (*) [2])&descriptor_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36c2c9,
                 (char (*) [2])&ref_type,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x39df2e,
                 (char (*) [3])&unqualified_name,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3a919c,ts_9)
      ;
    }
    ::std::__cxx11::string::operator=((string *)&name,(string *)&local_f8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (!bVar1) {
      get_type_address_space_abi_cxx11_(&local_f8,this,pSVar5,__k->id,false);
      ::std::__cxx11::string::operator=((string *)&descriptor_storage,(string *)&local_f8);
      ::std::__cxx11::string::~string((string *)&local_f8);
    }
    if (this->suppress_incompatible_pointer_types_discard_qualifiers == false) {
      this->suppress_incompatible_pointer_types_discard_qualifiers = true;
      Compiler::force_recompile_guarantee_forward_progress((Compiler *)this);
    }
    this->is_using_builtin_array = bVar3;
    this_00 = &ref_type;
  }
  ::std::__cxx11::string::~string((string *)this_00);
  bVar3 = is_var_runtime_size_array(this,aliased_var);
  if (bVar3) {
    pmVar7 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
    bVar3 = ::std::operator!=(&(pmVar7->decoration).qualified_alias,&name);
    if (bVar3) {
      Compiler::force_recompile((Compiler *)this);
    }
    Compiler::set_qualified_name((Compiler *)this,__k->id,&name);
  }
  else {
    id = __k->id;
    ::std::__cxx11::string::string((string *)&ref_type,"",(allocator *)&local_f8);
    Compiler::set_qualified_name((Compiler *)this,id,&ref_type);
    ::std::__cxx11::string::~string((string *)&ref_type);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&ref_type,this,(ulong)__k->id,1);
    CompilerGLSL::
    statement<std::__cxx11::string&,char_const(&)[8],std::__cxx11::string,char_const(&)[4],std::__cxx11::string&>
              (&this->super_CompilerGLSL,&descriptor_storage,(char (*) [8])" auto &",&ref_type,
               (char (*) [4])0x39e275,&name);
    ::std::__cxx11::string::~string((string *)&ref_type);
  }
  ::std::__cxx11::string::~string((string *)&descriptor_storage);
  ::std::__cxx11::string::~string((string *)&name);
  ::std::__cxx11::string::~string((string *)&unqualified_name);
  return;
}

Assistant:

void CompilerMSL::emit_argument_buffer_aliased_descriptor(const SPIRVariable &aliased_var,
                                                          const SPIRVariable &base_var)
{
	// To deal with buffer <-> image aliasing, we need to perform an unholy UB ritual.
	// A texture type in Metal 3.0 is a pointer. However, we cannot simply cast a pointer to texture.
	// What we *can* do is to cast pointer-to-pointer to pointer-to-texture.

	// We need to explicitly reach into the descriptor buffer lvalue, not any spvDescriptorArray wrapper.
	auto *var_meta = ir.find_meta(base_var.self);
	bool old_explicit_qualifier = var_meta && var_meta->decoration.qualified_alias_explicit_override;
	if (var_meta)
		var_meta->decoration.qualified_alias_explicit_override = false;
	auto unqualified_name = to_name(base_var.self, false);
	if (var_meta)
		var_meta->decoration.qualified_alias_explicit_override = old_explicit_qualifier;

	// For non-arrayed buffers, we have already performed a de-reference.
	// We need a proper lvalue to cast, so strip away the de-reference.
	if (unqualified_name.size() > 2 && unqualified_name[0] == '(' && unqualified_name[1] == '*')
	{
		unqualified_name.erase(unqualified_name.begin(), unqualified_name.begin() + 2);
		unqualified_name.pop_back();
	}

	string name;

	auto &var_type = get<SPIRType>(aliased_var.basetype);
	auto &data_type = get_variable_data_type(aliased_var);
	string descriptor_storage = descriptor_address_space(aliased_var.self, aliased_var.storage, "");

	if (aliased_var.storage == StorageClassUniformConstant)
	{
		if (is_var_runtime_size_array(aliased_var))
		{
			// This becomes a plain pointer to spvDescriptor.
			name = join("reinterpret_cast<", descriptor_storage, " ",
			            type_to_glsl(get_variable_data_type(aliased_var), aliased_var.self, true), ">(&",
			            unqualified_name, ")");
		}
		else
		{
			name = join("reinterpret_cast<", descriptor_storage, " ",
			            type_to_glsl(get_variable_data_type(aliased_var), aliased_var.self, true), " &>(",
			            unqualified_name, ");");
		}
	}
	else
	{
		// Buffer types.
		bool old_is_using_builtin_array = is_using_builtin_array;
		is_using_builtin_array = true;

		bool needs_post_cast_deref = !is_array(data_type);
		string ref_type = needs_post_cast_deref ? "&" : join("(&)", type_to_array_glsl(var_type, aliased_var.self));

		if (is_var_runtime_size_array(aliased_var))
		{
			name = join("reinterpret_cast<",
			            type_to_glsl(var_type, aliased_var.self, true), " ", descriptor_storage, " *>(&",
			            unqualified_name, ")");
		}
		else
		{
			name = join(needs_post_cast_deref ? "*" : "", "reinterpret_cast<",
			            type_to_glsl(var_type, aliased_var.self, true), " ", descriptor_storage, " ",
			            ref_type,
			            ">(", unqualified_name, ");");
		}

		if (needs_post_cast_deref)
			descriptor_storage = get_type_address_space(var_type, aliased_var.self, false);

		// These kinds of ridiculous casts trigger warnings in compiler. Just ignore them.
		if (!suppress_incompatible_pointer_types_discard_qualifiers)
		{
			suppress_incompatible_pointer_types_discard_qualifiers = true;
			force_recompile_guarantee_forward_progress();
		}

		is_using_builtin_array = old_is_using_builtin_array;
	}

	if (!is_var_runtime_size_array(aliased_var))
	{
		// Lower to temporary, so drop the qualification.
		set_qualified_name(aliased_var.self, "");
		statement(descriptor_storage, " auto &", to_name(aliased_var.self), " = ", name);
	}
	else
	{
		// This alias may have already been used to emit an entry point declaration. If there is a mismatch, we need a recompile.
		// Moving this code to be run earlier will also conflict,
		// because we need the qualified alias for the base resource,
		// so forcing recompile until things sync up is the least invasive method for now.
		if (ir.meta[aliased_var.self].decoration.qualified_alias != name)
			force_recompile();

		// This will get wrapped in a separate temporary when a spvDescriptorArray wrapper is emitted.
		set_qualified_name(aliased_var.self, name);
	}
}